

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AtomicMachine::RunStage(AtomicMachine *this,int stage)

{
  bool bVar1;
  int stage_local;
  AtomicMachine *this_local;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInStage(&this->super_ShaderImageLoadStoreBase,stage,8);
  if (bVar1) {
    bVar1 = Atomic<int>(this,stage,0x8235);
    if (bVar1) {
      bVar1 = Atomic<unsigned_int>(this,stage,0x8236);
      if (bVar1) {
        this_local = (AtomicMachine *)0x0;
      }
      else {
        this_local = (AtomicMachine *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AtomicMachine *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AtomicMachine *)0x10;
  }
  return (long)this_local;
}

Assistant:

long RunStage(int stage)
	{
		if (!SupportedInStage(stage, 8))
			return NOT_SUPPORTED;
		if (!Atomic<GLint>(stage, GL_R32I))
			return ERROR;
		if (!Atomic<GLuint>(stage, GL_R32UI))
			return ERROR;
		return NO_ERROR;
	}